

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1495::run(TestCase1495 *this)

{
  StructDataBitCount *this_00;
  Builder builder_00;
  bool bVar1;
  undefined8 in_stack_fffffffffffffcb0;
  bool local_329;
  undefined1 local_328 [7];
  bool _kj_shouldLog_15;
  bool local_2f1;
  undefined1 local_2f0 [7];
  bool _kj_shouldLog_14;
  bool local_2b9;
  undefined1 local_2b8 [7];
  bool _kj_shouldLog_13;
  bool local_281;
  undefined1 local_280 [7];
  bool _kj_shouldLog_12;
  bool local_24c;
  bool local_24b;
  bool local_24a;
  bool local_249;
  bool _kj_shouldLog_11;
  bool _kj_shouldLog_10;
  bool _kj_shouldLog_9;
  SegmentBuilder *pSStack_248;
  bool _kj_shouldLog_8;
  SegmentBuilder *pSStack_240;
  CapTableBuilder *local_238;
  void *pvStack_230;
  WirePointer *local_228;
  bool local_211;
  undefined1 local_210 [7];
  bool _kj_shouldLog_7;
  bool local_1d9;
  undefined1 local_1d8 [7];
  bool _kj_shouldLog_6;
  bool local_1a1;
  undefined1 local_1a0 [7];
  bool _kj_shouldLog_5;
  bool local_169;
  undefined1 local_168 [7];
  bool _kj_shouldLog_4;
  bool local_138;
  bool local_137;
  bool local_136;
  bool local_135;
  bool _kj_shouldLog_3;
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  undefined1 auStack_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase1495 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)auStack_128,(MessageBuilder *)this_00);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextField((Builder *)auStack_128);
  if (bVar1) {
    local_135 = kj::_::Debug::shouldLog(ERROR);
    while (local_135 != false) {
      kj::_::Debug::log<char_const(&)[40]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5dc,ERROR,"\"failed: expected \" \"!(root.hasTextField())\"",
                 (char (*) [40])"failed: expected !(root.hasTextField())");
      local_135 = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasDataField((Builder *)auStack_128);
  if (bVar1) {
    local_136 = kj::_::Debug::shouldLog(ERROR);
    while (local_136 != false) {
      kj::_::Debug::log<char_const(&)[40]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5dd,ERROR,"\"failed: expected \" \"!(root.hasDataField())\"",
                 (char (*) [40])"failed: expected !(root.hasDataField())");
      local_136 = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructField((Builder *)auStack_128)
  ;
  if (bVar1) {
    local_137 = kj::_::Debug::shouldLog(ERROR);
    while (local_137 != false) {
      kj::_::Debug::log<char_const(&)[42]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5de,ERROR,"\"failed: expected \" \"!(root.hasStructField())\"",
                 (char (*) [42])"failed: expected !(root.hasStructField())");
      local_137 = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt32List((Builder *)auStack_128);
  if (bVar1) {
    local_138 = kj::_::Debug::shouldLog(ERROR);
    while (local_138 != false) {
      kj::_::Debug::log<char_const(&)[40]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5df,ERROR,"\"failed: expected \" \"!(root.hasInt32List())\"",
                 (char (*) [40])"failed: expected !(root.hasInt32List())");
      local_138 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_168,(Builder *)auStack_128);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasTextField((Reader *)local_168);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_169 = kj::_::Debug::shouldLog(ERROR);
    while (local_169 != false) {
      kj::_::Debug::log<char_const(&)[51]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5e1,ERROR,"\"failed: expected \" \"!(root.asReader().hasTextField())\"",
                 (char (*) [51])"failed: expected !(root.asReader().hasTextField())");
      local_169 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_1a0,(Builder *)auStack_128);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasDataField((Reader *)local_1a0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_1a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a1 != false) {
      kj::_::Debug::log<char_const(&)[51]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5e2,ERROR,"\"failed: expected \" \"!(root.asReader().hasDataField())\"",
                 (char (*) [51])"failed: expected !(root.asReader().hasDataField())");
      local_1a1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_1d8,(Builder *)auStack_128);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasStructField((Reader *)local_1d8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_1d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d9 != false) {
      kj::_::Debug::log<char_const(&)[53]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5e3,ERROR,"\"failed: expected \" \"!(root.asReader().hasStructField())\"",
                 (char (*) [53])"failed: expected !(root.asReader().hasStructField())");
      local_1d9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_210,(Builder *)auStack_128);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasInt32List((Reader *)local_210);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_211 = kj::_::Debug::shouldLog(ERROR);
    while (local_211 != false) {
      kj::_::Debug::log<char_const(&)[51]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5e4,ERROR,"\"failed: expected \" \"!(root.asReader().hasInt32List())\"",
                 (char (*) [51])"failed: expected !(root.asReader().hasInt32List())");
      local_211 = false;
    }
  }
  local_228 = root._builder.pointers;
  local_238 = root._builder.capTable;
  pvStack_230 = root._builder.data;
  pSStack_248 = (SegmentBuilder *)auStack_128;
  pSStack_240 = root._builder.segment;
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffcb0;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffcb0 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffcb0 >> 0x30);
  initTestMessage(builder_00);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextField((Builder *)auStack_128);
  if (!bVar1) {
    local_249 = kj::_::Debug::shouldLog(ERROR);
    while (local_249 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5e8,ERROR,"\"failed: expected \" \"root.hasTextField()\"",
                 (char (*) [37])"failed: expected root.hasTextField()");
      local_249 = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasDataField((Builder *)auStack_128);
  if (!bVar1) {
    local_24a = kj::_::Debug::shouldLog(ERROR);
    while (local_24a != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5e9,ERROR,"\"failed: expected \" \"root.hasDataField()\"",
                 (char (*) [37])"failed: expected root.hasDataField()");
      local_24a = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructField((Builder *)auStack_128)
  ;
  if (!bVar1) {
    local_24b = kj::_::Debug::shouldLog(ERROR);
    while (local_24b != false) {
      kj::_::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5ea,ERROR,"\"failed: expected \" \"root.hasStructField()\"",
                 (char (*) [39])"failed: expected root.hasStructField()");
      local_24b = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt32List((Builder *)auStack_128);
  if (!bVar1) {
    local_24c = kj::_::Debug::shouldLog(ERROR);
    while (local_24c != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5eb,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
                 (char (*) [37])"failed: expected root.hasInt32List()");
      local_24c = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_280,(Builder *)auStack_128);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasTextField((Reader *)local_280);
  if (!bVar1) {
    local_281 = kj::_::Debug::shouldLog(ERROR);
    while (local_281 != false) {
      kj::_::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5ed,ERROR,"\"failed: expected \" \"root.asReader().hasTextField()\"",
                 (char (*) [48])"failed: expected root.asReader().hasTextField()");
      local_281 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_2b8,(Builder *)auStack_128);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasDataField((Reader *)local_2b8);
  if (!bVar1) {
    local_2b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2b9 != false) {
      kj::_::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5ee,ERROR,"\"failed: expected \" \"root.asReader().hasDataField()\"",
                 (char (*) [48])"failed: expected root.asReader().hasDataField()");
      local_2b9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_2f0,(Builder *)auStack_128);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasStructField((Reader *)local_2f0);
  if (!bVar1) {
    local_2f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2f1 != false) {
      kj::_::Debug::log<char_const(&)[50]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5ef,ERROR,"\"failed: expected \" \"root.asReader().hasStructField()\"",
                 (char (*) [50])"failed: expected root.asReader().hasStructField()");
      local_2f1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_328,(Builder *)auStack_128);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasInt32List((Reader *)local_328);
  if (!bVar1) {
    local_329 = kj::_::Debug::shouldLog(ERROR);
    while (local_329 != false) {
      kj::_::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5f0,ERROR,"\"failed: expected \" \"root.asReader().hasInt32List()\"",
                 (char (*) [48])"failed: expected root.asReader().hasInt32List()");
      local_329 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, Has) {
  MallocMessageBuilder builder;

  auto root = builder.initRoot<TestAllTypes>();

  EXPECT_FALSE(root.hasTextField());
  EXPECT_FALSE(root.hasDataField());
  EXPECT_FALSE(root.hasStructField());
  EXPECT_FALSE(root.hasInt32List());

  EXPECT_FALSE(root.asReader().hasTextField());
  EXPECT_FALSE(root.asReader().hasDataField());
  EXPECT_FALSE(root.asReader().hasStructField());
  EXPECT_FALSE(root.asReader().hasInt32List());

  initTestMessage(root);

  EXPECT_TRUE(root.hasTextField());
  EXPECT_TRUE(root.hasDataField());
  EXPECT_TRUE(root.hasStructField());
  EXPECT_TRUE(root.hasInt32List());

  EXPECT_TRUE(root.asReader().hasTextField());
  EXPECT_TRUE(root.asReader().hasDataField());
  EXPECT_TRUE(root.asReader().hasStructField());
  EXPECT_TRUE(root.asReader().hasInt32List());
}